

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O2

void ymf278b_pcm_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  char *pcVar1;
  YMF278BSlot *pYVar2;
  size_t __n;
  short *psVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  INT16 IVar10;
  INT16 IVar11;
  ushort uVar12;
  UINT32 UVar13;
  ulong uVar14;
  char cVar15;
  UINT16 pos;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  short sVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar24 = 0x4f;
  do {
    if (lVar24 + 0x34 == 0x563) {
      return;
    }
    pcVar1 = (char *)((long)info + lVar24);
    lVar24 = lVar24 + 0x34;
  } while (*pcVar1 == '\0');
  iVar5 = mix_level[*(int *)((long)info + 0x518)];
  iVar6 = mix_level[*(int *)((long)info + 0x51c)];
  uVar21 = 0;
  do {
    if (uVar21 == samples) {
      return;
    }
    for (lVar24 = 0; lVar24 != 0x4e0; lVar24 = lVar24 + 0x34) {
      if ((*(char *)((long)info + lVar24 + 0x4f) != '\0') &&
         (*(char *)((long)info + lVar24 + 0x51) == '\0')) {
        pYVar2 = (YMF278BSlot *)((long)info + lVar24 + 0x20);
        iVar7 = *(int *)((long)info + lVar24 + 0x30);
        IVar10 = ymf278b_getSample((YMF278BChip *)info,pYVar2,(UINT16)iVar7);
        pos = (UINT16)(iVar7 + 1U);
        uVar20 = (uint)*(ushort *)((long)info + lVar24 + 0x26);
        uVar17 = (iVar7 + 1U & 0xffff) + uVar20;
        if (0xffff < uVar17) {
          pos = (short)uVar17 + *(short *)((long)info + lVar24 + 0x24);
        }
        iVar22 = *(int *)((long)info + lVar24 + 0x2c);
        IVar11 = ymf278b_getSample((YMF278BChip *)info,pYVar2,pos);
        uVar16 = *(ushort *)((long)info + lVar24 + 0x32);
        cVar15 = *(char *)((long)info + lVar24 + 0x50);
        if ((cVar15 != '\0') && (uVar14 = (ulong)*(byte *)((long)info + lVar24 + 0x48), uVar14 != 0)
           ) {
          uVar17 = *(uint *)((long)info + lVar24 + 0x34);
          uVar23 = uVar17 >> 10;
          uVar18 = uVar23 & 0xff7f ^ 0x7f;
          if ((uVar17 >> 0x11 & 1) == 0) {
            uVar18 = uVar23;
          }
          uVar16 = uVar16 + (short)((uint)""[uVar14] * (uVar18 & 0xffff) >> 7);
        }
        uVar12 = 0x280;
        if (uVar16 < 0x280) {
          uVar12 = uVar16;
        }
        bVar9 = *(byte *)((long)info + lVar24 + 0x43);
        iVar8 = pan_right[bVar9];
        iVar22 = (((IVar11 * iVar22 + (0x10000 - iVar22) * (int)IVar10 >> 0x10) * vol_tab[uVar12] >>
                  0xf) * vol_tab[(ulong)*(byte *)((long)info + lVar24 + 0x42) * 4] >> 0xf) * 0x5a82
                 >> 0x11;
        (*outputs)[uVar21] =
             (*outputs)[uVar21] +
             ((int)((0x20 - (pan_left[bVar9] + iVar5 & 0xfU) >>
                    ((byte)((uint)(pan_left[bVar9] + iVar5) >> 4) & 0x1f)) * iVar22) >> 5);
        outputs[1][uVar21] =
             outputs[1][uVar21] +
             ((int)(iVar22 * (0x20 - (iVar8 + iVar6 & 0xfU) >>
                             ((byte)((uint)(iVar8 + iVar6) >> 4) & 0x1f))) >> 5);
        if ((cVar15 == '\0') || (uVar14 = (ulong)*(byte *)((long)info + lVar24 + 0x47), uVar14 == 0)
           ) {
          UVar13 = *(UINT32 *)((long)info + lVar24 + 0x28);
        }
        else {
          uVar17 = *(uint *)((long)info + lVar24 + 0x34);
          uVar23 = uVar17 >> 0xc;
          uVar18 = uVar23 & 0xffffffef ^ 0xf;
          if ((uVar17 >> 0x10 & 1) == 0) {
            uVar18 = uVar23;
          }
          uVar16 = -((ushort)uVar18 & 0xf);
          if ((uVar18 & 0x20) == 0) {
            uVar16 = (ushort)uVar18;
          }
          UVar13 = calcStep(*(INT8 *)((long)info + lVar24 + 0x3e),
                            *(UINT16 *)((long)info + lVar24 + 0x3c),
                            (INT16)(((int)vib_depth[uVar14] * (int)(short)uVar16) / 0xc));
        }
        uVar17 = UVar13 + *(int *)((long)info + lVar24 + 0x2c);
        *(uint *)((long)info + lVar24 + 0x2c) = uVar17;
        if (0xffff < uVar17) {
          uVar18 = (uVar17 >> 0x10) + iVar7;
          sVar19 = (short)uVar18;
          uVar20 = (uVar18 & 0xffff) + uVar20;
          if (0xffff < uVar20) {
            sVar19 = (short)uVar20 + *(short *)((long)info + lVar24 + 0x24);
          }
          *(short *)((long)info + lVar24 + 0x30) = sVar19;
          *(uint *)((long)info + lVar24 + 0x2c) = uVar17 & 0xffff;
        }
      }
    }
    iVar7 = *(int *)((long)info + 0x504);
    uVar17 = iVar7 + 1;
    *(uint *)((long)info + 0x504) = uVar17;
    if (8 < uVar17) {
      *(int *)((long)info + 0x504) = iVar7 + -8;
      cVar15 = *(char *)((long)info + 0x508);
      bVar9 = cVar15 + 1;
      *(byte *)((long)info + 0x508) = bVar9;
      if (2 < bVar9) {
        *(char *)((long)info + 0x508) = cVar15 + -2;
      }
    }
    *(int *)((long)info + 0x500) = *(int *)((long)info + 0x500) + 1;
    for (lVar24 = 0; lVar24 != 0x4e0; lVar24 = lVar24 + 0x34) {
      if (*(int *)((long)info + 0x504) == 0) {
        bVar9 = *(byte *)((long)info + lVar24 + 0x41);
        bVar4 = *(byte *)((long)info + lVar24 + 0x42);
        if (*(char *)((long)info + 0x508) == '\0') {
          cVar15 = '\x01';
          if (bVar4 < bVar9) goto LAB_001439b4;
        }
        else {
          cVar15 = -1;
          if (bVar9 < bVar4) {
LAB_001439b4:
            *(byte *)((long)info + lVar24 + 0x42) = cVar15 + bVar4;
          }
        }
      }
      if (*(char *)((long)info + lVar24 + 0x50) != '\0') {
        *(UINT32 *)((long)info + lVar24 + 0x34) =
             *(int *)((long)info + lVar24 + 0x34) +
             lfo_period[*(byte *)((long)info + lVar24 + 0x46)] & 0x3ffff;
      }
      uVar17 = (uint)*(byte *)((long)info + lVar24 + 0x4f);
      if (3 < uVar17 - 1) goto LAB_00143ae7;
      pYVar2 = (YMF278BSlot *)((long)info + lVar24 + 0x20);
      switch(uVar17) {
      case 1:
        uVar17 = (uint)*(byte *)((long)info + lVar24 + 0x4d);
        break;
      case 2:
        uVar17 = (uint)*(byte *)((long)info + lVar24 + 0x4b);
        break;
      case 3:
        uVar17 = (uint)*(byte *)((long)info + lVar24 + 0x4a);
        break;
      case 4:
        bVar9 = ymf278b_slot_compute_rate(pYVar2,(uint)*(byte *)((long)info + lVar24 + 0x49));
        if (bVar9 < 0x3f) {
          if ((*(uint *)((long)info + 0x500) &
              ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                       [bVar9] & 0x1f))) != 0) goto LAB_00143ae7;
          sVar19 = *(short *)((long)info + lVar24 + 0x32);
          *(short *)((long)info + lVar24 + 0x32) =
               (short)((uint)""[(ulong)(*(uint *)((long)info + 0x500) >>
                                        ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                         [bVar9] & 0x1f) & 7) + (ulong)"pppp"[bVar9]] * ~(int)sVar19
                      >> 4) + sVar19;
          goto LAB_00143adf;
        }
        goto LAB_00143ae7;
      }
      bVar9 = ymf278b_slot_compute_decay_rate(pYVar2,uVar17);
      if ((*(uint *)((long)info + 0x500) &
          ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                   [bVar9] & 0x1f))) == 0) {
        psVar3 = (short *)((long)info + lVar24 + 0x32);
        *psVar3 = *psVar3 + (ushort)""[(ulong)(*(uint *)((long)info + 0x500) >>
                                               ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                [bVar9] & 0x1f) & 7) + (ulong)"pppp"[bVar9]];
LAB_00143adf:
        ymf278b_eg_phase_switch(pYVar2);
      }
LAB_00143ae7:
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

static void ymf278b_pcm_update(void *info, UINT32 samples, DEV_SMPL** outputs)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	UINT32 j;
	INT32 vl;
	INT32 vr;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	
	if (! ymf278b_anyActive(chip))
	{
		// TODO update internal state, even if muted
		// TODO also mute individual channels
		return;
	}

	vl = mix_level[chip->pcm_l];
	vr = mix_level[chip->pcm_r];
	for (j = 0; j < samples; j ++)
	{
		for (i = 0; i < 24; i ++)
		{
			YMF278BSlot* sl;
			INT16 sample;
			INT32 smplOut;
			UINT16 envVol;
			INT32 volLeft;
			INT32 volRight;
			UINT32 step;
			
			sl = &chip->slots[i];
			if (sl->state == EG_OFF || sl->Muted)
			{
				//outputs[0][j] += 0;
				//outputs[1][j] += 0;
				continue;
			}

			sample = (ymf278b_getSample(chip, sl, sl->pos) * (0x10000 - sl->stepptr) +
			          ymf278b_getSample(chip, sl, ymf278b_nextPos(sl, sl->pos, 1)) * sl->stepptr) >> 16;
			
			// TL levels are 00..FF internally (TL register value 7F is mapped to TL level FF)
			// Envelope levels have 4x the resolution (000..3FF)
			// Volume levels are approximate logarithmic: -6 db result in half volume. Steps in between use linear interpolation.
			// A volume of -60 db or lower results in silence. (value 0x280..0x3FF).
			// Recordings from actual hardware indicate, that TL level and envelope level are applied separately.
			// Each of them is clipped to silence below -60 db, but TL+envelope might result in a lower volume. -Valley Bell
			envVol = (UINT16)sl->env_vol;
			if (sl->lfo_active && sl->AM)
				envVol += ymf278b_slot_compute_am(sl);
			if (envVol >= MAX_ATT_INDEX)
				envVol = MAX_ATT_INDEX;
			smplOut = (sample * vol_tab[envVol]) >> 15;
			smplOut = (smplOut * vol_tab[sl->TL << TL_SHIFT]) >> 15;

			// Panning is also done separately. (low-volume TL + low-volume panning goes below -60 db)
			// I'll be taking wild guess and assume that -3 db is approximated with 75%. (same as with TL and envelope levels)
			// The same applies to the PCM mix level.
			volLeft  = pan_left [sl->pan] + vl;
			volRight = pan_right[sl->pan] + vr;
			// 0 -> 0x20, 8 -> 0x18, 16 -> 0x10, 24 -> 0x0C, etc. (not using vol_tab here saves array boundary checks)
			volLeft  = (0x20 - (volLeft  & 0x0F)) >> (volLeft  >> 4);
			volRight = (0x20 - (volRight & 0x0F)) >> (volRight >> 4);
			
			smplOut = (smplOut * 0x5A82) >> 17;	// reduce volume by -15 db, should bring it into balance with FM
			outputs[0][j] += (smplOut * volLeft ) >> 5;
			outputs[1][j] += (smplOut * volRight) >> 5;

			step = (sl->lfo_active && sl->vib)
			     ? calcStep(sl->OCT, sl->FN, ymf278b_slot_compute_vib(sl))
			     : sl->step;
			sl->stepptr += step;

			if (sl->stepptr >= 0x10000)
			{
				sl->pos = ymf278b_nextPos(sl, sl->pos, sl->stepptr >> 16);
				sl->stepptr &= 0xFFFF;
			}
		}
		ymf278b_advance(chip);
	}
}